

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  NodeRef *pNVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  long lVar21;
  float *vertices_2;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  ulong in_R10;
  size_t mask;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  float *vertices;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  uint uVar68;
  uint uVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  uint uVar74;
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  NodeRef *local_1508;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  Scene *scene;
  ulong local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  ulong local_1498;
  ulong local_1490;
  ulong local_1488;
  ulong local_1480;
  RTCFilterFunctionNArguments args;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  byte local_1377;
  float local_1368 [4];
  undefined1 local_1358 [16];
  float local_1348 [4];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  RTCHitN local_1308 [16];
  undefined4 local_12f8;
  undefined4 uStack_12f4;
  undefined4 uStack_12f0;
  undefined4 uStack_12ec;
  undefined4 local_12e8;
  undefined4 uStack_12e4;
  undefined4 uStack_12e0;
  undefined4 uStack_12dc;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  uint local_1298;
  uint uStack_1294;
  uint uStack_1290;
  uint uStack_128c;
  uint uStack_1288;
  uint uStack_1284;
  uint uStack_1280;
  uint uStack_127c;
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1508 = stack + 1;
  stack[0] = root;
  auVar58 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar75 = ZEXT3264(auVar58);
  auVar59 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar76 = ZEXT3264(auVar59);
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar77 = ZEXT3264(auVar60);
  auVar39 = vmulss_avx512f(auVar58._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar65 = auVar39._0_4_;
  auVar39 = vmulss_avx512f(auVar59._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar68 = auVar39._0_4_;
  auVar39 = vmulss_avx512f(auVar60._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar69 = auVar39._0_4_;
  local_1488 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1490 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_1498 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_14a0 = local_1488 ^ 0x20;
  local_14a8 = local_1490 ^ 0x20;
  local_14b0 = local_1498 ^ 0x20;
  auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar78 = ZEXT3264(auVar58);
  auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar79 = ZEXT3264(auVar58);
  auVar58._0_8_ = CONCAT44(uVar65,uVar65) ^ 0x8000000080000000;
  auVar58._8_4_ = uVar65 ^ 0x80000000;
  auVar58._12_4_ = uVar65 ^ 0x80000000;
  auVar58._16_4_ = uVar65 ^ 0x80000000;
  auVar58._20_4_ = uVar65 ^ 0x80000000;
  auVar58._24_4_ = uVar65 ^ 0x80000000;
  auVar58._28_4_ = uVar65 ^ 0x80000000;
  auVar59._0_8_ = CONCAT44(uVar68,uVar68) ^ 0x8000000080000000;
  auVar59._8_4_ = uVar68 ^ 0x80000000;
  auVar59._12_4_ = uVar68 ^ 0x80000000;
  auVar59._16_4_ = uVar68 ^ 0x80000000;
  auVar59._20_4_ = uVar68 ^ 0x80000000;
  auVar59._24_4_ = uVar68 ^ 0x80000000;
  auVar59._28_4_ = uVar68 ^ 0x80000000;
  auVar60._0_8_ = CONCAT44(uVar69,uVar69) ^ 0x8000000080000000;
  auVar60._8_4_ = uVar69 ^ 0x80000000;
  auVar60._12_4_ = uVar69 ^ 0x80000000;
  auVar60._16_4_ = uVar69 ^ 0x80000000;
  auVar60._20_4_ = uVar69 ^ 0x80000000;
  auVar60._24_4_ = uVar69 ^ 0x80000000;
  auVar60._28_4_ = uVar69 ^ 0x80000000;
  auVar39 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  do {
    pNVar18 = local_1508;
    if (local_1508 == stack) break;
    sVar25 = local_1508[-1].ptr;
    local_1508 = local_1508 + -1;
    do {
      if ((sVar25 & 8) == 0) {
        uVar19 = sVar25 & 0xfffffffffffffff0;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar67._4_4_ = uVar2;
        auVar67._0_4_ = uVar2;
        auVar67._8_4_ = uVar2;
        auVar67._12_4_ = uVar2;
        auVar67._16_4_ = uVar2;
        auVar67._20_4_ = uVar2;
        auVar67._24_4_ = uVar2;
        auVar67._28_4_ = uVar2;
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_1488),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_1488));
        auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar75._0_32_,auVar58);
        auVar62 = vmaxps_avx512vl(auVar78._0_32_,auVar61);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_1490),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_1490));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_1498),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_1498));
        auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar76._0_32_,auVar59);
        auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar56),auVar77._0_32_,auVar60);
        auVar61 = vmaxps_avx(auVar61,auVar63);
        auVar61 = vmaxps_avx(auVar62,auVar61);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_14a0),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_14a0));
        auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar75._0_32_,auVar58);
        auVar63 = vminps_avx512vl(auVar79._0_32_,auVar62);
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_14a8),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_14a8));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_14b0),auVar67,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_14b0));
        auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar51),auVar76._0_32_,auVar59);
        auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar56),auVar77._0_32_,auVar60);
        auVar62 = vminps_avx(auVar62,auVar64);
        auVar62 = vminps_avx(auVar63,auVar62);
        if (((uint)sVar25 & 7) == 6) {
          uVar17 = vcmpps_avx512vl(auVar61,auVar62,2);
          uVar14 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar19 + 0x1c0),0xd);
          uVar15 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
          bVar37 = (byte)uVar17 & (byte)uVar14 & (byte)uVar15;
        }
        else {
          uVar17 = vcmpps_avx512vl(auVar61,auVar62,2);
          bVar37 = (byte)uVar17;
        }
        in_R10 = CONCAT44((int)(in_R10 >> 0x20),(uint)bVar37);
      }
      if ((sVar25 & 8) == 0) {
        if (in_R10 == 0) {
          uVar65 = 4;
        }
        else {
          uVar24 = sVar25 & 0xfffffffffffffff0;
          lVar21 = 0;
          for (uVar19 = in_R10; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar65 = 0;
          for (uVar19 = in_R10 - 1 & in_R10; sVar25 = *(size_t *)(uVar24 + lVar21 * 8), uVar19 != 0;
              uVar19 = uVar19 - 1 & uVar19) {
            local_1508->ptr = sVar25;
            local_1508 = local_1508 + 1;
            lVar21 = 0;
            for (uVar34 = uVar19; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
          }
        }
      }
      else {
        uVar65 = 6;
      }
    } while (uVar65 == 0);
    if (uVar65 == 6) {
      uVar65 = 0;
      local_14b8 = (ulong)((uint)sVar25 & 0xf) - 8;
      bVar35 = local_14b8 != 0;
      if (bVar35) {
        uVar24 = sVar25 & 0xfffffffffffffff0;
        uVar19 = 0;
        do {
          lVar20 = uVar19 * 0x50;
          scene = context->scene;
          pGVar9 = (scene->geometries).items[*(uint *)(uVar24 + 0x30 + lVar20)].ptr;
          fVar70 = (pGVar9->time_range).lower;
          fVar70 = pGVar9->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar70) /
                   ((pGVar9->time_range).upper - fVar70));
          auVar51 = vroundss_avx(ZEXT416((uint)fVar70),ZEXT416((uint)fVar70),9);
          auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
          auVar11 = vmaxss_avx(ZEXT816(0) << 0x20,auVar51);
          lVar32 = (long)(int)auVar11._0_4_ * 0x38;
          lVar21 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar32);
          auVar51 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar24 + lVar20) * 4);
          uVar34 = (ulong)*(uint *)(uVar24 + 0x10 + lVar20);
          auVar56 = *(undefined1 (*) [16])(lVar21 + uVar34 * 4);
          uVar38 = (ulong)*(uint *)(uVar24 + 0x20 + lVar20);
          auVar4 = *(undefined1 (*) [16])(lVar21 + uVar38 * 4);
          uVar23 = (ulong)*(uint *)(uVar24 + 4 + lVar20);
          auVar40 = *(undefined1 (*) [16])(lVar21 + uVar23 * 4);
          uVar26 = (ulong)*(uint *)(uVar24 + 0x14 + lVar20);
          auVar52 = *(undefined1 (*) [16])(lVar21 + uVar26 * 4);
          uVar27 = (ulong)*(uint *)(uVar24 + 0x24 + lVar20);
          auVar55 = *(undefined1 (*) [16])(lVar21 + uVar27 * 4);
          uVar28 = (ulong)*(uint *)(uVar24 + 8 + lVar20);
          auVar41 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
          uVar29 = (ulong)*(uint *)(uVar24 + 0x18 + lVar20);
          auVar43 = *(undefined1 (*) [16])(lVar21 + uVar29 * 4);
          uVar30 = (ulong)*(uint *)(uVar24 + 0x28 + lVar20);
          auVar54 = *(undefined1 (*) [16])(lVar21 + uVar30 * 4);
          uVar22 = (ulong)*(uint *)(uVar24 + 0xc + lVar20);
          auVar5 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
          uVar31 = (ulong)*(uint *)(uVar24 + 0x1c + lVar20);
          auVar53 = *(undefined1 (*) [16])(lVar21 + uVar31 * 4);
          lVar32 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar32);
          uVar33 = (ulong)*(uint *)(uVar24 + 0x2c + lVar20);
          auVar42 = *(undefined1 (*) [16])(lVar21 + uVar33 * 4);
          auVar44 = *(undefined1 (*) [16])(lVar32 + (ulong)*(uint *)(uVar24 + lVar20) * 4);
          auVar45 = *(undefined1 (*) [16])(lVar32 + uVar34 * 4);
          auVar48 = *(undefined1 (*) [16])(lVar32 + uVar38 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar32 + uVar23 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar32 + uVar26 * 4);
          auVar49 = *(undefined1 (*) [16])(lVar32 + uVar27 * 4);
          auVar50 = *(undefined1 (*) [16])(lVar32 + uVar28 * 4);
          auVar66 = *(undefined1 (*) [16])(lVar32 + uVar29 * 4);
          auVar6 = *(undefined1 (*) [16])(lVar32 + uVar30 * 4);
          auVar57 = *(undefined1 (*) [16])(lVar32 + uVar22 * 4);
          auVar7 = *(undefined1 (*) [16])(lVar32 + uVar31 * 4);
          auVar8 = *(undefined1 (*) [16])(lVar32 + uVar33 * 4);
          puVar1 = (undefined8 *)(uVar24 + 0x30 + lVar20);
          local_13c8 = *puVar1;
          uStack_13c0 = puVar1[1];
          puVar1 = (undefined8 *)(uVar24 + 0x40 + lVar20);
          auVar12 = vunpcklps_avx(auVar51,auVar41);
          auVar51 = vunpckhps_avx(auVar51,auVar41);
          auVar41 = vunpcklps_avx(auVar40,auVar5);
          auVar40 = vunpckhps_avx(auVar40,auVar5);
          auVar5 = vunpcklps_avx(auVar51,auVar40);
          auVar13 = vunpcklps_avx(auVar12,auVar41);
          auVar51 = vunpckhps_avx(auVar12,auVar41);
          auVar41 = vunpcklps_avx(auVar56,auVar43);
          auVar56 = vunpckhps_avx(auVar56,auVar43);
          auVar43 = vunpcklps_avx(auVar52,auVar53);
          auVar40 = vunpckhps_avx(auVar52,auVar53);
          auVar52 = vunpcklps_avx(auVar56,auVar40);
          auVar53 = vunpcklps_avx(auVar41,auVar43);
          auVar56 = vunpckhps_avx(auVar41,auVar43);
          auVar41 = vunpcklps_avx(auVar4,auVar54);
          auVar4 = vunpckhps_avx(auVar4,auVar54);
          auVar43 = vunpcklps_avx(auVar55,auVar42);
          auVar40 = vunpckhps_avx(auVar55,auVar42);
          auVar55 = vunpcklps_avx(auVar4,auVar40);
          auVar54 = vunpcklps_avx(auVar41,auVar43);
          auVar4 = vunpckhps_avx(auVar41,auVar43);
          auVar40 = vunpcklps_avx512vl(auVar44,auVar50);
          auVar41 = vunpckhps_avx512vl(auVar44,auVar50);
          auVar42 = vunpcklps_avx512vl(auVar46,auVar57);
          auVar43 = vunpckhps_avx512vl(auVar46,auVar57);
          auVar41 = vunpcklps_avx(auVar41,auVar43);
          auVar43 = vunpcklps_avx(auVar40,auVar42);
          auVar40 = vunpckhps_avx(auVar40,auVar42);
          auVar42 = vunpcklps_avx512vl(auVar45,auVar66);
          auVar44 = vunpckhps_avx512vl(auVar45,auVar66);
          auVar45 = vunpcklps_avx512vl(auVar47,auVar7);
          auVar46 = vunpckhps_avx512vl(auVar47,auVar7);
          auVar44 = vunpcklps_avx512vl(auVar44,auVar46);
          auVar46 = vunpcklps_avx512vl(auVar42,auVar45);
          auVar45 = vunpckhps_avx512vl(auVar42,auVar45);
          auVar47 = vunpcklps_avx512vl(auVar48,auVar6);
          auVar42 = vunpckhps_avx512vl(auVar48,auVar6);
          auVar48 = vunpcklps_avx512vl(auVar49,auVar8);
          auVar49 = vunpckhps_avx512vl(auVar49,auVar8);
          auVar42 = vunpcklps_avx(auVar42,auVar49);
          auVar49 = vunpcklps_avx512vl(auVar47,auVar48);
          auVar48 = vunpckhps_avx512vl(auVar47,auVar48);
          auVar50 = ZEXT416((uint)(fVar70 - auVar11._0_4_));
          auVar47 = vbroadcastss_avx512vl(auVar50);
          auVar50 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
          auVar66._0_4_ = auVar50._0_4_;
          auVar66._4_4_ = auVar66._0_4_;
          auVar66._8_4_ = auVar66._0_4_;
          auVar66._12_4_ = auVar66._0_4_;
          auVar43 = vmulps_avx512vl(auVar47,auVar43);
          auVar40 = vmulps_avx512vl(auVar47,auVar40);
          auVar50 = vmulps_avx512vl(auVar47,auVar41);
          auVar41 = vfmadd231ps_fma(auVar43,auVar66,auVar13);
          auVar43 = vfmadd231ps_fma(auVar40,auVar66,auVar51);
          auVar5 = vfmadd231ps_fma(auVar50,auVar66,auVar5);
          auVar51 = vmulps_avx512vl(auVar47,auVar46);
          auVar40 = vmulps_avx512vl(auVar47,auVar45);
          auVar44 = vmulps_avx512vl(auVar47,auVar44);
          auVar51 = vfmadd231ps_fma(auVar51,auVar66,auVar53);
          auVar56 = vfmadd231ps_fma(auVar40,auVar66,auVar56);
          auVar40 = vfmadd231ps_fma(auVar44,auVar66,auVar52);
          auVar52 = vmulps_avx512vl(auVar47,auVar49);
          auVar53 = vmulps_avx512vl(auVar47,auVar48);
          auVar42 = vmulps_avx512vl(auVar47,auVar42);
          auVar52 = vfmadd231ps_fma(auVar52,auVar66,auVar54);
          auVar54 = vfmadd231ps_fma(auVar53,auVar66,auVar4);
          auVar55 = vfmadd231ps_fma(auVar42,auVar66,auVar55);
          local_13d8 = *puVar1;
          uStack_13d0 = puVar1[1];
          auVar51 = vsubps_avx(auVar41,auVar51);
          auVar56 = vsubps_avx(auVar43,auVar56);
          auVar4 = vsubps_avx(auVar5,auVar40);
          auVar40 = vsubps_avx(auVar52,auVar41);
          auVar53 = vsubps_avx512vl(auVar54,auVar43);
          auVar52 = vsubps_avx(auVar55,auVar5);
          auVar42._0_4_ = auVar56._0_4_ * auVar52._0_4_;
          auVar42._4_4_ = auVar56._4_4_ * auVar52._4_4_;
          auVar42._8_4_ = auVar56._8_4_ * auVar52._8_4_;
          auVar42._12_4_ = auVar56._12_4_ * auVar52._12_4_;
          local_1338 = vfmsub231ps_avx512vl(auVar42,auVar53,auVar4);
          auVar44._0_4_ = auVar4._0_4_ * auVar40._0_4_;
          auVar44._4_4_ = auVar4._4_4_ * auVar40._4_4_;
          auVar44._8_4_ = auVar4._8_4_ * auVar40._8_4_;
          auVar44._12_4_ = auVar4._12_4_ * auVar40._12_4_;
          local_1328 = vfmsub231ps_fma(auVar44,auVar52,auVar51);
          auVar54 = vmulps_avx512vl(auVar51,auVar53);
          fVar70 = *(float *)(ray + k * 4 + 0x40);
          auVar46._4_4_ = fVar70;
          auVar46._0_4_ = fVar70;
          auVar46._8_4_ = fVar70;
          auVar46._12_4_ = fVar70;
          fVar71 = *(float *)(ray + k * 4 + 0x50);
          auVar47._4_4_ = fVar71;
          auVar47._0_4_ = fVar71;
          auVar47._8_4_ = fVar71;
          auVar47._12_4_ = fVar71;
          auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar2 = *(undefined4 *)(ray + k * 4);
          auVar55._4_4_ = uVar2;
          auVar55._0_4_ = uVar2;
          auVar55._8_4_ = uVar2;
          auVar55._12_4_ = uVar2;
          auVar44 = vsubps_avx512vl(auVar41,auVar55);
          local_1318 = vfmsub231ps_fma(auVar54,auVar40,auVar56);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar41._4_4_ = uVar2;
          auVar41._0_4_ = uVar2;
          auVar41._8_4_ = uVar2;
          auVar41._12_4_ = uVar2;
          auVar45 = vsubps_avx512vl(auVar43,auVar41);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar43._4_4_ = uVar2;
          auVar43._0_4_ = uVar2;
          auVar43._8_4_ = uVar2;
          auVar43._12_4_ = uVar2;
          auVar43 = vsubps_avx512vl(auVar5,auVar43);
          auVar48._0_4_ = fVar71 * auVar43._0_4_;
          auVar48._4_4_ = fVar71 * auVar43._4_4_;
          auVar48._8_4_ = fVar71 * auVar43._8_4_;
          auVar48._12_4_ = fVar71 * auVar43._12_4_;
          auVar48 = vfmsub231ps_avx512vl(auVar48,auVar45,auVar42);
          auVar55 = vmulps_avx512vl(auVar42,auVar44);
          auVar55 = vfmsub231ps_fma(auVar55,auVar43,auVar46);
          auVar50._0_4_ = fVar70 * auVar45._0_4_;
          auVar50._4_4_ = fVar70 * auVar45._4_4_;
          auVar50._8_4_ = fVar70 * auVar45._8_4_;
          auVar50._12_4_ = fVar70 * auVar45._12_4_;
          auVar41 = vfmsub231ps_fma(auVar50,auVar44,auVar47);
          auVar54 = vmulps_avx512vl(local_1318,auVar42);
          auVar54 = vfmadd231ps_avx512vl(auVar54,local_1328,auVar47);
          auVar42 = vfmadd231ps_avx512vl(auVar54,local_1338,auVar46);
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          local_1388 = vandps_avx512vl(auVar42,auVar54);
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar54 = vandps_avx512vl(auVar42,auVar5);
          auVar49._0_4_ = auVar52._0_4_ * auVar41._0_4_;
          auVar49._4_4_ = auVar52._4_4_ * auVar41._4_4_;
          auVar49._8_4_ = auVar52._8_4_ * auVar41._8_4_;
          auVar49._12_4_ = auVar52._12_4_ * auVar41._12_4_;
          auVar52 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar53);
          auVar40 = vfmadd231ps_fma(auVar52,auVar48,auVar40);
          uVar65 = auVar54._0_4_;
          local_13b8._0_4_ = (float)(uVar65 ^ auVar40._0_4_);
          uVar68 = auVar54._4_4_;
          local_13b8._4_4_ = (float)(uVar68 ^ auVar40._4_4_);
          uVar69 = auVar54._8_4_;
          local_13b8._8_4_ = (float)(uVar69 ^ auVar40._8_4_);
          uVar74 = auVar54._12_4_;
          local_13b8._12_4_ = (float)(uVar74 ^ auVar40._12_4_);
          auVar40._0_4_ = auVar4._0_4_ * auVar41._0_4_;
          auVar40._4_4_ = auVar4._4_4_ * auVar41._4_4_;
          auVar40._8_4_ = auVar4._8_4_ * auVar41._8_4_;
          auVar40._12_4_ = auVar4._12_4_ * auVar41._12_4_;
          auVar56 = vfmadd231ps_fma(auVar40,auVar56,auVar55);
          auVar51 = vfmadd231ps_fma(auVar56,auVar51,auVar48);
          local_13a8._0_4_ = (float)(uVar65 ^ auVar51._0_4_);
          local_13a8._4_4_ = (float)(uVar68 ^ auVar51._4_4_);
          local_13a8._8_4_ = (float)(uVar69 ^ auVar51._8_4_);
          local_13a8._12_4_ = (float)(uVar74 ^ auVar51._12_4_);
          auVar51 = ZEXT816(0) << 0x20;
          uVar17 = vcmpps_avx512vl(local_13b8,auVar51,5);
          uVar14 = vcmpps_avx512vl(local_13a8,auVar51,5);
          uVar15 = vcmpps_avx512vl(auVar42,auVar51,4);
          auVar51._0_4_ = local_13a8._0_4_ + local_13b8._0_4_;
          auVar51._4_4_ = local_13a8._4_4_ + local_13b8._4_4_;
          auVar51._8_4_ = local_13a8._8_4_ + local_13b8._8_4_;
          auVar51._12_4_ = local_13a8._12_4_ + local_13b8._12_4_;
          uVar16 = vcmpps_avx512vl(auVar51,local_1388,2);
          local_1377 = (byte)uVar17 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
          if (local_1377 != 0) {
            auVar52._0_4_ = local_1318._0_4_ * auVar43._0_4_;
            auVar52._4_4_ = local_1318._4_4_ * auVar43._4_4_;
            auVar52._8_4_ = local_1318._8_4_ * auVar43._8_4_;
            auVar52._12_4_ = local_1318._12_4_ * auVar43._12_4_;
            auVar51 = vfmadd213ps_fma(auVar45,local_1328,auVar52);
            auVar51 = vfmadd213ps_fma(auVar44,local_1338,auVar51);
            local_1398._0_4_ = (float)(uVar65 ^ auVar51._0_4_);
            local_1398._4_4_ = (float)(uVar68 ^ auVar51._4_4_);
            local_1398._8_4_ = (float)(uVar69 ^ auVar51._8_4_);
            local_1398._12_4_ = (float)(uVar74 ^ auVar51._12_4_);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar56._4_4_ = uVar2;
            auVar56._0_4_ = uVar2;
            auVar56._8_4_ = uVar2;
            auVar56._12_4_ = uVar2;
            auVar51 = vmulps_avx512vl(local_1388,auVar56);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar4._4_4_ = uVar2;
            auVar4._0_4_ = uVar2;
            auVar4._8_4_ = uVar2;
            auVar4._12_4_ = uVar2;
            auVar56 = vmulps_avx512vl(local_1388,auVar4);
            uVar17 = vcmpps_avx512vl(local_1398,auVar56,2);
            uVar14 = vcmpps_avx512vl(auVar51,local_1398,1);
            local_1377 = (byte)uVar17 & (byte)uVar14 & local_1377;
            if (local_1377 != 0) {
              auVar51 = vrcp14ps_avx512vl(local_1388);
              auVar53._8_4_ = 0x3f800000;
              auVar53._0_8_ = &DAT_3f8000003f800000;
              auVar53._12_4_ = 0x3f800000;
              auVar56 = vfnmadd213ps_avx512vl(local_1388,auVar51,auVar53);
              auVar51 = vfmadd132ps_fma(auVar56,auVar51,auVar51);
              fVar70 = auVar51._0_4_;
              fVar71 = auVar51._4_4_;
              fVar72 = auVar51._8_4_;
              fVar73 = auVar51._12_4_;
              local_1348[0] = fVar70 * local_1398._0_4_;
              local_1348[1] = fVar71 * local_1398._4_4_;
              local_1348[2] = fVar72 * local_1398._8_4_;
              local_1348[3] = fVar73 * local_1398._12_4_;
              local_1368[0] = fVar70 * local_13b8._0_4_;
              local_1368[1] = fVar71 * local_13b8._4_4_;
              local_1368[2] = fVar72 * local_13b8._8_4_;
              local_1368[3] = fVar73 * local_13b8._12_4_;
              local_1358._0_4_ = fVar70 * local_13a8._0_4_;
              local_1358._4_4_ = fVar71 * local_13a8._4_4_;
              local_1358._8_4_ = fVar72 * local_13a8._8_4_;
              local_1358._12_4_ = fVar73 * local_13a8._12_4_;
              uVar34 = (ulong)local_1377;
              local_1480 = uVar19;
              do {
                uVar22 = 0;
                for (uVar38 = uVar34; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000)
                {
                  uVar22 = uVar22 + 1;
                }
                pGVar9 = (scene->geometries).items[*(uint *)((long)&local_13c8 + uVar22 * 4)].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
                  bVar36 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar36 = false;
                }
                else {
                  local_1278 = auVar79._0_32_;
                  local_1258 = auVar78._0_32_;
                  local_1238 = auVar77._0_32_;
                  local_1218 = auVar76._0_32_;
                  local_11f8 = auVar75._0_32_;
                  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uVar38 = (ulong)(uint)((int)uVar22 * 4);
                  uVar3 = *(undefined4 *)((long)local_1368 + uVar38);
                  local_12d8._4_4_ = uVar3;
                  local_12d8._0_4_ = uVar3;
                  local_12d8._8_4_ = uVar3;
                  local_12d8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_1358 + uVar38);
                  local_12c8._4_4_ = uVar3;
                  local_12c8._0_4_ = uVar3;
                  local_12c8._8_4_ = uVar3;
                  local_12c8._12_4_ = uVar3;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_1348 + uVar38);
                  args.context = context->user;
                  local_12a8 = vpbroadcastd_avx512vl();
                  uVar3 = *(undefined4 *)((long)&local_13d8 + uVar38);
                  local_12b8._4_4_ = uVar3;
                  local_12b8._0_4_ = uVar3;
                  local_12b8._8_4_ = uVar3;
                  local_12b8._12_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_1338 + uVar38);
                  local_12f8 = *(undefined4 *)(local_1328 + uVar38);
                  local_12e8 = *(undefined4 *)(local_1318 + uVar38);
                  local_1308[0] = (RTCHitN)(char)uVar3;
                  local_1308[1] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1308[2] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1308[3] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1308[4] = (RTCHitN)(char)uVar3;
                  local_1308[5] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1308[6] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1308[7] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1308[8] = (RTCHitN)(char)uVar3;
                  local_1308[9] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1308[10] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1308[0xb] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  local_1308[0xc] = (RTCHitN)(char)uVar3;
                  local_1308[0xd] = (RTCHitN)(char)((uint)uVar3 >> 8);
                  local_1308[0xe] = (RTCHitN)(char)((uint)uVar3 >> 0x10);
                  local_1308[0xf] = (RTCHitN)(char)((uint)uVar3 >> 0x18);
                  uStack_12f4 = local_12f8;
                  uStack_12f0 = local_12f8;
                  uStack_12ec = local_12f8;
                  uStack_12e4 = local_12e8;
                  uStack_12e0 = local_12e8;
                  uStack_12dc = local_12e8;
                  vpcmpeqd_avx2(ZEXT1632(local_12a8),ZEXT1632(local_12a8));
                  uStack_1294 = (args.context)->instID[0];
                  local_1298 = uStack_1294;
                  uStack_1290 = uStack_1294;
                  uStack_128c = uStack_1294;
                  uStack_1288 = (args.context)->instPrimID[0];
                  uStack_1284 = uStack_1288;
                  uStack_1280 = uStack_1288;
                  uStack_127c = uStack_1288;
                  local_13e8 = auVar39._0_8_;
                  uStack_13e0 = auVar39._8_8_;
                  local_14d8 = local_13e8;
                  uStack_14d0 = uStack_13e0;
                  args.valid = (int *)&local_14d8;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.hit = local_1308;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&args);
                  }
                  auVar45._8_8_ = uStack_14d0;
                  auVar45._0_8_ = local_14d8;
                  uVar38 = vptestmd_avx512vl(auVar45,auVar45);
                  if ((uVar38 & 0xf) == 0) {
                    bVar36 = true;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                    }
                    auVar6._8_8_ = uStack_14d0;
                    auVar6._0_8_ = local_14d8;
                    uVar38 = vptestmd_avx512vl(auVar6,auVar6);
                    uVar38 = uVar38 & 0xf;
                    auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar36 = (bool)((byte)uVar38 & 1);
                    auVar57._0_4_ =
                         (uint)bVar36 * auVar51._0_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x80);
                    bVar36 = (bool)((byte)(uVar38 >> 1) & 1);
                    auVar57._4_4_ =
                         (uint)bVar36 * auVar51._4_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x84);
                    bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                    auVar57._8_4_ =
                         (uint)bVar36 * auVar51._8_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x88);
                    bVar36 = SUB81(uVar38 >> 3,0);
                    auVar57._12_4_ =
                         (uint)bVar36 * auVar51._12_4_ | (uint)!bVar36 * *(int *)(args.ray + 0x8c);
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
                    bVar36 = (byte)uVar38 == 0;
                  }
                  if (bVar36) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar2;
                    uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
                  }
                  auVar75 = ZEXT3264(local_11f8);
                  auVar76 = ZEXT3264(local_1218);
                  auVar77 = ZEXT3264(local_1238);
                  auVar78 = ZEXT3264(local_1258);
                  auVar79 = ZEXT3264(local_1278);
                }
                uVar65 = 0;
                if (!bVar36) {
                  if (bVar35) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar65 = 1;
                  }
                  goto LAB_00840a29;
                }
              } while (uVar34 != 0);
            }
          }
          uVar65 = 0;
          uVar19 = uVar19 + 1;
          bVar35 = uVar19 < local_14b8;
        } while (uVar19 != local_14b8);
      }
    }
LAB_00840a29:
  } while ((uVar65 & 3) == 0);
  return pNVar18 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }